

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O3

void __thiscall libtorrent::state_changed_alert::~state_changed_alert(state_changed_alert *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__torrent_alert_004dc350;
  p_Var2 = (this->super_torrent_alert).handle.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

struct TORRENT_EXPORT state_changed_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT state_changed_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, torrent_status::state_t st
			, torrent_status::state_t prev_st);

		TORRENT_DEFINE_ALERT_PRIO(state_changed_alert, 10, alert_priority::high)

		static inline constexpr alert_category_t static_category = alert_category::status;

		std::string message() const override;

		// the new state of the torrent.
		torrent_status::state_t const state;

		// the previous state.
		torrent_status::state_t const prev_state;
	}